

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Endpoints.cpp
# Opt level: O3

void __thiscall
helics::Endpoint::Endpoint(Endpoint *this,MessageFederate *mFed,string_view name,string_view type)

{
  pointer pcVar1;
  undefined4 uVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  Endpoint *pEVar9;
  
  pEVar9 = helics::MessageFederate::registerEndpoint(mFed,name,type);
  (this->super_Interface)._vptr_Interface = (_func_int **)&PTR__Interface_0053e040;
  (this->super_Interface).mCore = (pEVar9->super_Interface).mCore;
  (this->super_Interface).handle.hid = (pEVar9->super_Interface).handle.hid;
  (this->super_Interface).mName._M_dataplus._M_p = (pointer)&(this->super_Interface).mName.field_2;
  pcVar1 = (pEVar9->super_Interface).mName._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_Interface).mName,pcVar1,
             pcVar1 + (pEVar9->super_Interface).mName._M_string_length);
  (this->super_Interface)._vptr_Interface = (_func_int **)&PTR__Endpoint_0053f0b8;
  uVar2 = *(undefined4 *)((long)&pEVar9->fed + 4);
  iVar3 = pEVar9->referenceIndex;
  uVar4 = *(undefined4 *)&pEVar9->field_0x44;
  uVar5 = *(undefined4 *)((long)&pEVar9->referenceIndex + 2);
  uVar6 = *(undefined4 *)&pEVar9->field_0x46;
  uVar7 = *(undefined4 *)((long)&pEVar9->dataReference + 2);
  uVar8 = *(undefined4 *)((long)&pEVar9->dataReference + 6);
  *(undefined4 *)&this->fed = *(undefined4 *)&pEVar9->fed;
  *(undefined4 *)((long)&this->fed + 4) = uVar2;
  this->referenceIndex = iVar3;
  *(undefined4 *)&this->field_0x44 = uVar4;
  *(undefined4 *)((long)&this->referenceIndex + 2) = uVar5;
  *(undefined4 *)&this->field_0x46 = uVar6;
  *(undefined4 *)((long)&this->dataReference + 2) = uVar7;
  *(undefined4 *)((long)&this->dataReference + 6) = uVar8;
  (this->defDest)._M_dataplus._M_p = (pointer)&(this->defDest).field_2;
  pcVar1 = (pEVar9->defDest)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->defDest,pcVar1,pcVar1 + (pEVar9->defDest)._M_string_length);
  return;
}

Assistant:

Endpoint::Endpoint(MessageFederate* mFed, std::string_view name, std::string_view type):
    Endpoint(mFed->registerEndpoint(name, type))
{
}